

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<pstore::address>,testing::Matcher<unsigned_long>,testing::Matcher<bool>,testing::Matcher<bool>>,std::tuple<pstore::address,unsigned_long,bool,bool>>
               (tuple<testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                *matcher_tuple,tuple<pstore::address,_unsigned_long,_bool,_bool> *value_tuple)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0026f960;
  bVar1 = MatcherBase<pstore::address>::MatchAndExplain
                    ((MatcherBase<pstore::address> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                      ).super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>,
                     &(value_tuple->
                      super__Tuple_impl<0UL,_pstore::address,_unsigned_long,_bool,_bool>).
                      super__Head_base<0UL,_pstore::address,_false>._M_head_impl,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0026f960;
    bVar1 = MatcherBase<unsigned_long>::MatchAndExplain
                      ((MatcherBase<unsigned_long> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                        .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>,
                       &(value_tuple->
                        super__Tuple_impl<0UL,_pstore::address,_unsigned_long,_bool,_bool>).
                        super__Tuple_impl<1UL,_unsigned_long,_bool,_bool>.
                        super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }